

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathEqualNodeSetFloat(xmlXPathParserContextPtr ctxt,xmlXPathObjectPtr arg,double f,int neq)

{
  double val_00;
  xmlNodeSetPtr pxVar1;
  int iVar2;
  xmlChar *val_01;
  xmlXPathObjectPtr pxVar3;
  double v;
  xmlXPathObjectPtr val;
  xmlChar *str2;
  xmlNodeSetPtr ns;
  int local_30;
  int ret;
  int i;
  int neq_local;
  double f_local;
  xmlXPathObjectPtr arg_local;
  xmlXPathParserContextPtr ctxt_local;
  
  ns._4_4_ = 0;
  if ((arg == (xmlXPathObjectPtr)0x0) ||
     ((arg->type != XPATH_NODESET && (arg->type != XPATH_XSLT_TREE)))) {
    ctxt_local._4_4_ = 0;
  }
  else {
    pxVar1 = arg->nodesetval;
    if (pxVar1 != (xmlNodeSetPtr)0x0) {
      for (local_30 = 0; local_30 < pxVar1->nodeNr; local_30 = local_30 + 1) {
        val_01 = xmlXPathCastNodeToString(pxVar1->nodeTab[local_30]);
        if (val_01 != (xmlChar *)0x0) {
          pxVar3 = xmlXPathCacheNewString(ctxt->context,val_01);
          valuePush(ctxt,pxVar3);
          (*xmlFree)(val_01);
          xmlXPathNumberFunction(ctxt,1);
          pxVar3 = valuePop(ctxt);
          val_00 = pxVar3->floatval;
          xmlXPathReleaseObject(ctxt->context,pxVar3);
          iVar2 = xmlXPathIsNaN(val_00);
          if (iVar2 == 0) {
            if (neq == 0) {
              if ((val_00 == f) && (!NAN(val_00) && !NAN(f))) {
                ns._4_4_ = 1;
                break;
              }
            }
            if ((neq != 0) && ((val_00 != f || (NAN(val_00) || NAN(f))))) {
              ns._4_4_ = 1;
              break;
            }
          }
          else if (neq != 0) {
            ns._4_4_ = 1;
          }
        }
      }
    }
    ctxt_local._4_4_ = ns._4_4_;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlXPathEqualNodeSetFloat(xmlXPathParserContextPtr ctxt,
    xmlXPathObjectPtr arg, double f, int neq) {
  int i, ret=0;
  xmlNodeSetPtr ns;
  xmlChar *str2;
  xmlXPathObjectPtr val;
  double v;

    if ((arg == NULL) ||
	((arg->type != XPATH_NODESET) && (arg->type != XPATH_XSLT_TREE)))
        return(0);

    ns = arg->nodesetval;
    if (ns != NULL) {
	for (i=0;i<ns->nodeNr;i++) {
	    str2 = xmlXPathCastNodeToString(ns->nodeTab[i]);
	    if (str2 != NULL) {
		valuePush(ctxt, xmlXPathCacheNewString(ctxt->context, str2));
		xmlFree(str2);
		xmlXPathNumberFunction(ctxt, 1);
		val = valuePop(ctxt);
		v = val->floatval;
		xmlXPathReleaseObject(ctxt->context, val);
		if (!xmlXPathIsNaN(v)) {
		    if ((!neq) && (v==f)) {
			ret = 1;
			break;
		    } else if ((neq) && (v!=f)) {
			ret = 1;
			break;
		    }
		} else {	/* NaN is unequal to any value */
		    if (neq)
			ret = 1;
		}
	    }
	}
    }

    return(ret);
}